

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::PointRenderCase::genVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  ostringstream buf;
  ostream oStack_198;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oStack_198);
  std::operator<<(&oStack_198,
                  "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 vtx_color;\nuniform highp vec4 u_posScale;\n\n"
                 );
  if (*(char *)((long)this + 0x80) == '\0') {
    poVar1 = std::operator<<(&oStack_198,
                             "uniform highp vec4 u_primitiveBBoxMin;\nuniform highp vec4 u_primitiveBBoxMax;\n\nflat out highp float v_"
                            );
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    pcVar2 = glcts::fixed_sample_locations_values + 1;
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_expansionSize;\nflat out highp vec3 v_");
    pcVar2 = glcts::fixed_sample_locations_values + 1;
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_clipMin;\nflat out highp vec3 v_");
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar3 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::operator<<(poVar1,"bbox_clipMax;\n\n");
  }
  poVar1 = std::operator<<(&oStack_198,
                           "void main()\n{\n\thighp vec2 patternOffset = u_posScale.xy;\n\thighp vec2 patternScale = u_posScale.zw;\n\thighp float pointSize = "
                          );
  pcVar2 = "1.0";
  if (((*(char *)((long)this + 0xd8) == '\x01') && (*(char *)((long)this + 0x80) == '\0')) &&
     (pcVar2 = "(a_color.g > 0.0) ? (5.0) : (3.0)", *(char *)((long)this + 0x81) != '\0')) {
    pcVar2 = "1.0";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,";\n");
  std::operator<<(poVar1,
                  "\tgl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n\tgl_PointSize = pointSize;\n\tvtx_color = a_color;\n"
                 );
  if (*(char *)((long)this + 0x80) == '\0') {
    poVar1 = std::operator<<(&oStack_198,"\n\tv_");
    pcVar3 = glcts::fixed_sample_locations_values + 1;
    pcVar2 = glcts::fixed_sample_locations_values + 1;
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,"bbox_expansionSize = pointSize;\n\tv_");
    pcVar2 = glcts::fixed_sample_locations_values + 1;
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar2 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1,
                             "bbox_clipMin =\n\t    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n\tv_"
                            );
    if (*(char *)((long)this + 0x81) != '\0') {
      pcVar3 = "geo_";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    std::operator<<(poVar1,
                    "bbox_clipMax =\n\t    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n\t        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n"
                   );
  }
  std::operator<<(&oStack_198,"}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string PointRenderCase::genVertexSource (void) const
{
	std::ostringstream	buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"in highp vec4 a_position;\n"
			"in highp vec4 a_color;\n"
			"out highp vec4 vtx_color;\n"
			"uniform highp vec4 u_posScale;\n"
			"\n";
	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"uniform highp vec4 u_primitiveBBoxMin;\n"
				"uniform highp vec4 u_primitiveBBoxMax;\n"
				"\n"
				"flat out highp float v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin;\n"
				"flat out highp vec3 v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax;\n"
				"\n";
	}

	buf <<	"void main()\n"
			"{\n"
			"	highp vec2 patternOffset = u_posScale.xy;\n"
			"	highp vec2 patternScale = u_posScale.zw;\n"
			"	highp float pointSize = "
					<< ((m_isWidePointCase && !m_hasTessellationStage && !m_hasGeometryStage) ? ("(a_color.g > 0.0) ? (5.0) : (3.0)") : ("1.0"))
					<< ";\n"
		<<	"	gl_Position = vec4(a_position.xy * patternScale + patternOffset, a_position.z, a_position.w);\n"
			"	gl_PointSize = pointSize;\n"
			"	vtx_color = a_color;\n";

	if (!m_hasTessellationStage)
	{
		DE_ASSERT(m_useGlobalState);
		buf <<	"\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_expansionSize = pointSize;\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMin =\n"
				"	    min(vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMin.x, u_primitiveBBoxMin.y, u_primitiveBBoxMin.z) / u_primitiveBBoxMax.w);\n"
				"	v_" << (m_hasGeometryStage ? "geo_" : "") << "bbox_clipMax =\n"
				"	    min(vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMin.w,\n"
				"	        vec3(u_primitiveBBoxMax.x, u_primitiveBBoxMax.y, u_primitiveBBoxMax.z) / u_primitiveBBoxMax.w);\n";
	}

	buf <<	"}\n";
	return buf.str();
}